

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseExpression(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ParseState copy;
  ParseState copy2;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar8 = false;
    goto LAB_00265dfe;
  }
  bVar7 = ParseTemplateParam(state);
  bVar8 = true;
  if (bVar7) goto LAB_00265dfe;
  bVar7 = ParseExprPrimary(state);
  if (bVar7) goto LAB_00265dfe;
  uVar4 = (state->parse_state).mangled_idx;
  uVar5 = (state->parse_state).out_cur_idx;
  uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar7 = ParseTwoCharToken(state,"cl");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) {
      do {
        bVar7 = ParseExpression(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      bVar8 = true;
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1 = &state->parse_state;
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseThreeCharToken(state,"pp_");
  if (bVar7) {
LAB_00265d12:
    bVar7 = ParseExpression(state);
    bVar8 = true;
    if (bVar7) goto LAB_00265dfe;
  }
  else {
    bVar7 = ParseThreeCharToken(state,"mm_");
    if (bVar7) goto LAB_00265d12;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"cp");
  if (bVar7) {
    bVar7 = ParseSourceName(state);
    if (bVar7) {
      ParseTemplateArgs(state);
      do {
        bVar7 = ParseExpression(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      bVar8 = true;
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"so");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) {
        do {
          ParseNumber(state,(int *)0x0);
          bVar7 = ParseOneCharToken(state,'_');
        } while (bVar7);
        ParseOneCharToken(state,'p');
        bVar7 = ParseOneCharToken(state,'E');
        bVar8 = true;
        if (bVar7) goto LAB_00265dfe;
      }
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseFunctionParam(state);
  bVar8 = true;
  if (bVar7) goto LAB_00265dfe;
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"tl");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) {
      do {
        bVar7 = ParseBracedExpression(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"il");
  if (bVar7) {
    do {
      bVar7 = ParseBracedExpression(state);
    } while (bVar7);
    bVar7 = ParseOneCharToken(state,'E');
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  ParseTwoCharToken(state,"gs");
  bVar7 = ParseTwoCharToken(state,"nw");
  if (bVar7) {
LAB_00265ec9:
    do {
      bVar7 = ParseExpression(state);
    } while (bVar7);
    bVar7 = ParseOneCharToken(state,'_');
    if (bVar7) {
      bVar7 = ParseType(state);
      if (bVar7) {
        bVar7 = ParseOneCharToken(state,'E');
        if (bVar7) goto LAB_00265dfe;
        bVar7 = ParseInitializer(state);
        if (bVar7) goto LAB_00265dfe;
      }
    }
  }
  else {
    bVar7 = ParseTwoCharToken(state,"na");
    if (bVar7) goto LAB_00265ec9;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  ParseTwoCharToken(state,"gs");
  bVar7 = ParseTwoCharToken(state,"dl");
  if (bVar7) {
LAB_00265f54:
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  else {
    bVar7 = ParseTwoCharToken(state,"da");
    if (bVar7) goto LAB_00265f54;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseCharClass(state,"dscr");
  if (bVar7) {
    bVar7 = ParseOneCharToken(state,'c');
    if (bVar7) {
      bVar7 = ParseType(state);
      if (bVar7) {
        bVar7 = ParseExpression(state);
        if (bVar7) goto LAB_00265dfe;
      }
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"cv");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) {
      local_28._0_4_ = pPVar1->mangled_idx;
      local_28._4_4_ = pPVar1->out_cur_idx;
      uStack_20 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar7 = ParseOneCharToken(state,'_');
      if (bVar7) {
        do {
          bVar7 = ParseExpression(state);
        } while (bVar7);
        bVar7 = ParseOneCharToken(state,'E');
        if (bVar7) goto LAB_00265dfe;
      }
      pPVar1->mangled_idx = (uint)local_28;
      pPVar1->out_cur_idx = local_28._4_4_;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_20;
      bVar7 = ParseExpression(state);
LAB_00266081:
      if (bVar7 != false) goto LAB_00265dfe;
    }
  }
  else {
    local_28 = CONCAT44(local_28._4_4_,0xffffffff);
    bVar7 = ParseOperatorName(state,(int *)&local_28);
    if (bVar7 && 0 < (int)(uint)local_28) {
      if (2 < (uint)local_28) {
        bVar7 = ParseExpression(state);
        if (!bVar7) goto LAB_00266089;
      }
      uVar9 = (uint)local_28;
      if (1 < (int)(uint)local_28) {
        bVar7 = ParseExpression(state);
        if (!bVar7) goto LAB_00266089;
        uVar9 = (uint)local_28;
      }
      if ((int)uVar9 < 1) goto LAB_00265dfe;
      bVar7 = ParseExpression(state);
      goto LAB_00266081;
    }
  }
LAB_00266089:
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"ti");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"te");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"st");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"at");
  if (bVar7) {
    bVar7 = ParseType(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"az");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"nx");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"sZ");
  if (bVar7) {
    bVar7 = ParseFunctionParam(state);
    if (bVar7) goto LAB_00265dfe;
    bVar7 = ParseTemplateParam(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"sP");
  if (bVar7) {
    do {
      bVar7 = ParseTemplateArg(state);
    } while (bVar7);
    bVar7 = ParseOneCharToken(state,'E');
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"fl");
  if (bVar7) {
LAB_00266230:
    bVar7 = ParseOperatorName(state,(int *)0x0);
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) goto LAB_00265dfe;
    }
  }
  else {
    bVar7 = ParseTwoCharToken(state,"fr");
    if (bVar7) goto LAB_00266230;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"fL");
  if (bVar7) {
LAB_0026627c:
    bVar7 = ParseOperatorName(state,(int *)0x0);
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) {
        bVar7 = ParseExpression(state);
        if (bVar7) goto LAB_00265dfe;
      }
    }
  }
  else {
    bVar7 = ParseTwoCharToken(state,"fR");
    if (bVar7) goto LAB_0026627c;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"tw");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"tr");
  if (bVar7) goto LAB_00265dfe;
  bVar7 = ParseTwoCharToken(state,"dt");
  if (bVar7) {
LAB_00266316:
    bVar7 = ParseExpression(state);
    if (bVar7) {
      bVar7 = ParseUnresolvedName(state);
      if (bVar7) goto LAB_00265dfe;
    }
  }
  else {
    bVar7 = ParseTwoCharToken(state,"pt");
    if (bVar7) goto LAB_00266316;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"ds");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"sp");
  if (bVar7) {
    bVar7 = ParseExpression(state);
    if (bVar7) goto LAB_00265dfe;
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseOneCharToken(state,'u');
  if (bVar7) {
    bVar7 = ParseSourceName(state);
    if (bVar7) {
      do {
        bVar7 = ParseTemplateArg(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"rq");
  if (bVar7) {
    bVar7 = ParseRequirement(state);
    if (bVar7) {
      do {
        bVar7 = ParseRequirement(state);
      } while (bVar7);
      bVar7 = ParseOneCharToken(state,'E');
      if (bVar7) goto LAB_00265dfe;
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar7 = ParseTwoCharToken(state,"rQ");
  if (bVar7) {
    bVar7 = ParseBareFunctionType(state);
    if (bVar7) {
      bVar7 = ParseOneCharToken(state,'_');
      if (bVar7) {
        bVar7 = ParseRequirement(state);
        if (bVar7) {
          do {
            bVar7 = ParseRequirement(state);
          } while (bVar7);
          bVar7 = ParseOneCharToken(state,'E');
          if (bVar7) goto LAB_00265dfe;
        }
      }
    }
  }
  pPVar1->mangled_idx = uVar4;
  pPVar1->out_cur_idx = uVar5;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  bVar8 = ParseUnresolvedName(state);
LAB_00265dfe:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  ParseState copy = state->parse_state;

  // Object/function call expression.
  if (ParseTwoCharToken(state, "cl") && OneOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Preincrement and predecrement.  Postincrement and postdecrement are handled
  // by the operator-name logic later on.
  if ((ParseThreeCharToken(state, "pp_") ||
       ParseThreeCharToken(state, "mm_")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Clang-specific "cp <simple-id> <expression>* E"
  //   https://clang.llvm.org/doxygen/ItaniumMangle_8cpp_source.html#l04338
  if (ParseTwoCharToken(state, "cp") && ParseSimpleId(state) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= so <type> <expression> [<number>] <union-selector>* [p] E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/47
  if (ParseTwoCharToken(state, "so") && ParseType(state) &&
      ParseExpression(state) && Optional(ParseNumber(state, nullptr)) &&
      ZeroOrMore(ParseUnionSelector, state) &&
      Optional(ParseOneCharToken(state, 'p')) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= <function-param>
  if (ParseFunctionParam(state)) return true;
  state->parse_state = copy;

  // <expression> ::= tl <type> <braced-expression>* E
  if (ParseTwoCharToken(state, "tl") && ParseType(state) &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= il <braced-expression>* E
  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] nw <expression>* _ <type> E
  //              ::= [gs] nw <expression>* _ <type> <initializer>
  //              ::= [gs] na <expression>* _ <type> E
  //              ::= [gs] na <expression>* _ <type> <initializer>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "nw") || ParseTwoCharToken(state, "na")) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, '_') &&
      ParseType(state) &&
      (ParseOneCharToken(state, 'E') || ParseInitializer(state))) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] dl <expression>
  //              ::= [gs] da <expression>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "dl") || ParseTwoCharToken(state, "da")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // dynamic_cast, static_cast, const_cast, reinterpret_cast.
  //
  // <expression> ::= (dc | sc | cc | rc) <type> <expression>
  if (ParseCharClass(state, "dscr") && ParseOneCharToken(state, 'c') &&
      ParseType(state) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parse the conversion expressions jointly to avoid re-parsing the <type> in
  // their common prefix.  Parsed as:
  // <expression> ::= cv <type> <conversion-args>
  // <conversion-args> ::= _ <expression>* E
  //                   ::= <expression>
  //
  // Also don't try ParseOperatorName after seeing "cv", since ParseOperatorName
  // also needs to accept "cv <type>" in other contexts.
  if (ParseTwoCharToken(state, "cv")) {
    if (ParseType(state)) {
      ParseState copy2 = state->parse_state;
      if (ParseOneCharToken(state, '_') && ZeroOrMore(ParseExpression, state) &&
          ParseOneCharToken(state, 'E')) {
        return true;
      }
      state->parse_state = copy2;
      if (ParseExpression(state)) {
        return true;
      }
    }
  } else {
    // Parse unary, binary, and ternary operator expressions jointly, taking
    // care not to re-parse subexpressions repeatedly. Parse like:
    //   <expression> ::= <operator-name> <expression>
    //                    [<one-to-two-expressions>]
    //   <one-to-two-expressions> ::= <expression> [<expression>]
    int arity = -1;
    if (ParseOperatorName(state, &arity) &&
        arity > 0 &&  // 0 arity => disabled.
        (arity < 3 || ParseExpression(state)) &&
        (arity < 2 || ParseExpression(state)) &&
        (arity < 1 || ParseExpression(state))) {
      return true;
    }
  }
  state->parse_state = copy;

  // typeid(type)
  if (ParseTwoCharToken(state, "ti") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // typeid(expression)
  if (ParseTwoCharToken(state, "te") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof type
  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(type)
  if (ParseTwoCharToken(state, "at") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(expression), a GNU extension
  if (ParseTwoCharToken(state, "az") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // noexcept(expression) appearing as an expression in a dependent signature
  if (ParseTwoCharToken(state, "nx") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack)
  //
  // <expression> ::= sZ <template-param>
  //              ::= sZ <function-param>
  if (ParseTwoCharToken(state, "sZ") &&
      (ParseFunctionParam(state) || ParseTemplateParam(state))) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack) captured from an alias template
  //
  // <expression> ::= sP <template-arg>* E
  if (ParseTwoCharToken(state, "sP") && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Unary folds (... op pack) and (pack op ...).
  //
  // <expression> ::= fl <binary operator-name> <expression>
  //              ::= fr <binary operator-name> <expression>
  if ((ParseTwoCharToken(state, "fl") || ParseTwoCharToken(state, "fr")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Binary folds (init op ... op pack) and (pack op ... op init).
  //
  // <expression> ::= fL <binary operator-name> <expression> <expression>
  //              ::= fR <binary operator-name> <expression> <expression>
  if ((ParseTwoCharToken(state, "fL") || ParseTwoCharToken(state, "fR")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tw <expression>: throw e
  if (ParseTwoCharToken(state, "tw") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tr: throw (rethrows an exception from the handler that caught it)
  if (ParseTwoCharToken(state, "tr")) return true;

  // Object and pointer member access expressions.
  //
  // <expression> ::= (dt | pt) <expression> <unresolved-name>
  if ((ParseTwoCharToken(state, "dt") || ParseTwoCharToken(state, "pt")) &&
      ParseExpression(state) && ParseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Pointer-to-member access expressions.  This parses the same as a binary
  // operator, but it's implemented separately because "ds" shouldn't be
  // accepted in other contexts that parse an operator name.
  if (ParseTwoCharToken(state, "ds") && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parameter pack expansion
  if (ParseTwoCharToken(state, "sp") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Vendor extended expressions
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state) &&
      ZeroOrMore(ParseTemplateArg, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rq <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rq") && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rQ <bare-function-type> _ <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rQ") && ParseBareFunctionType(state) &&
      ParseOneCharToken(state, '_') && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return ParseUnresolvedName(state);
}